

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

void absl::anon_unknown_0::EncodeResult<float>
               (CalculatedFloat *calculated,bool negative,Nonnull<absl::from_chars_result_*> result,
               Nonnull<float_*> value)

{
  float *in_RCX;
  long in_RDX;
  byte in_SIL;
  long *in_RDI;
  float fVar1;
  float fVar2;
  bool in_stack_ffffffffffffffbf;
  undefined8 in_stack_ffffffffffffffc0;
  float local_24;
  
  if ((int)in_RDI[1] == 99999) {
    *(undefined4 *)(in_RDX + 8) = 0x22;
    fVar1 = std::numeric_limits<float>::max();
    fVar2 = std::numeric_limits<float>::max();
    local_24 = -fVar1;
    if ((in_SIL & 1) == 0) {
      local_24 = fVar2;
    }
    *in_RCX = local_24;
  }
  else if ((*in_RDI == 0) || ((int)in_RDI[1] == -99999)) {
    *(undefined4 *)(in_RDX + 8) = 0x22;
    fVar1 = -0.0;
    if ((in_SIL & 1) == 0) {
      fVar1 = 0.0;
    }
    *in_RCX = fVar1;
  }
  else {
    fVar1 = FloatTraits<float>::Make
                      ((mantissa_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                       (int)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
    *in_RCX = fVar1;
  }
  return;
}

Assistant:

void EncodeResult(const CalculatedFloat& calculated, bool negative,
                  absl::Nonnull<absl::from_chars_result*> result,
                  absl::Nonnull<FloatType*> value) {
  if (calculated.exponent == kOverflow) {
    result->ec = std::errc::result_out_of_range;
    *value = negative ? -std::numeric_limits<FloatType>::max()
                      : std::numeric_limits<FloatType>::max();
    return;
  } else if (calculated.mantissa == 0 || calculated.exponent == kUnderflow) {
    result->ec = std::errc::result_out_of_range;
    *value = negative ? -0.0 : 0.0;
    return;
  }
  *value = FloatTraits<FloatType>::Make(
      static_cast<typename FloatTraits<FloatType>::mantissa_t>(
          calculated.mantissa),
      calculated.exponent, negative);
}